

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestHugeFieldNumbersLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  TestHugeFieldNumbersLite **v1;
  TestHugeFieldNumbersLite **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  RepeatedField<int> *pRVar5;
  RepeatedField<int> *pRVar6;
  uint32_t *puVar7;
  Arena *pAVar8;
  ForeignMessageLite *pFVar9;
  TestHugeFieldNumbersLite_OptionalGroup *pTVar10;
  TestAllTypesLite *pTVar11;
  string *psVar12;
  anon_union_168_1_493b367e_for_TestHugeFieldNumbersLite_3 *paVar13;
  TestHugeFieldNumbersLite *pTVar14;
  bool bVar15;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  Voidify local_e2;
  byte local_e1;
  LogMessage local_e0;
  Voidify local_c9;
  uint local_c8;
  uint32_t cached_has_bits;
  LogMessage local_b8;
  Voidify local_a1;
  TestHugeFieldNumbersLite *local_a0;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestHugeFieldNumbersLite *from;
  TestHugeFieldNumbersLite *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_60;
  void *local_58;
  Nullable<const_char_*> local_50;
  ThreadSafeArena *local_48;
  Nullable<const_char_*> local_40;
  string *local_38;
  TestHugeFieldNumbersLite *local_30;
  anon_union_168_1_493b367e_for_TestHugeFieldNumbersLite_3 *local_28;
  string *local_20;
  TestHugeFieldNumbersLite *local_18;
  anon_union_168_1_493b367e_for_TestHugeFieldNumbersLite_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestHugeFieldNumbersLite *)to_msg;
  _this = (TestHugeFieldNumbersLite *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_a0 = (TestHugeFieldNumbersLite *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestHugeFieldNumbersLite_const*>(&local_a0);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestHugeFieldNumbersLite*>(&from);
  local_98 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestHugeFieldNumbersLite_const*,proto2_unittest::TestHugeFieldNumbersLite*>
                       (v1,v2,"&from != _this");
  if (local_98 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_98);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x2afe,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b8);
  }
  local_c8 = 0;
  pRVar5 = _internal_mutable_repeated_int32(from);
  pRVar6 = _internal_repeated_int32((TestHugeFieldNumbersLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar5,pRVar6);
  pRVar5 = _internal_mutable_packed_int32(from);
  pRVar6 = _internal_packed_int32((TestHugeFieldNumbersLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar5,pRVar6);
  google::protobuf::internal::
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(from->field_0)._impl_.string_string_map_,
              (MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(arena->impl_).first_arena_.cleanup_list_.limit_);
  puVar7 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).first_owner_,0);
  pTVar14 = from;
  local_c8 = *puVar7;
  if ((local_c8 & 0x7f) != 0) {
    if ((local_c8 & 1) != 0) {
      local_38 = _internal_optional_string_abi_cxx11_((TestHugeFieldNumbersLite *)arena);
      local_30 = pTVar14;
      local_28 = &pTVar14->field_0;
      puVar7 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar14->field_0)._impl_._has_bits_,0);
      psVar12 = local_38;
      *puVar7 = *puVar7 | 1;
      pAVar8 = google::protobuf::MessageLite::GetArena(&pTVar14->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar14->field_0)._impl_.optional_string_,psVar12,pAVar8);
    }
    pTVar14 = from;
    if ((local_c8 & 2) != 0) {
      local_20 = _internal_optional_bytes_abi_cxx11_((TestHugeFieldNumbersLite *)arena);
      local_18 = pTVar14;
      local_10 = &pTVar14->field_0;
      puVar7 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar14->field_0)._impl_._has_bits_,0);
      psVar12 = local_20;
      *puVar7 = *puVar7 | 2;
      pAVar8 = google::protobuf::MessageLite::GetArena(&pTVar14->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar14->field_0)._impl_.optional_bytes_,psVar12,pAVar8);
    }
    if ((local_c8 & 4) != 0) {
      local_e1 = 0;
      if ((arena->impl_).first_arena_.space_allocated_.super___atomic_base<unsigned_long>._M_i == 0)
      {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x2b0e,"from._impl_.optional_message_ != nullptr");
        local_e1 = 1;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar4);
      }
      if ((local_e1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      if ((from->field_0)._impl_.optional_message_ == (ForeignMessageLite *)0x0) {
        to_msg_local = (MessageLite *)
                       (arena->impl_).first_arena_.space_allocated_.
                       super___atomic_base<unsigned_long>._M_i;
        local_60 = absl_log_internal_check_op_result;
        pFVar9 = (ForeignMessageLite *)
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optional_message_ = pFVar9;
      }
      else {
        ForeignMessageLite::MergeFrom
                  ((from->field_0)._impl_.optional_message_,
                   (ForeignMessageLite *)
                   (arena->impl_).first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                   _M_i);
      }
    }
    if ((local_c8 & 8) != 0) {
      if ((arena->impl_).first_arena_.parent_ == (ThreadSafeArena *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x2b16,"from._impl_.optionalgroup_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&oneof_from_case);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_e2,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case);
      }
      if ((from->field_0)._impl_.optionalgroup_ == (TestHugeFieldNumbersLite_OptionalGroup *)0x0) {
        local_48 = (arena->impl_).first_arena_.parent_;
        local_40 = absl_log_internal_check_op_result;
        pTVar10 = (TestHugeFieldNumbersLite_OptionalGroup *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup>
                            ((Arena *)absl_log_internal_check_op_result,local_48);
        (from->field_0)._impl_.optionalgroup_ = pTVar10;
      }
      else {
        TestHugeFieldNumbersLite_OptionalGroup::MergeFrom
                  ((from->field_0)._impl_.optionalgroup_,
                   (TestHugeFieldNumbersLite_OptionalGroup *)(arena->impl_).first_arena_.parent_);
      }
    }
    if ((local_c8 & 0x10) != 0) {
      (from->field_0)._impl_.optional_int32_ =
           *(int32_t *)&(arena->impl_).first_arena_.cached_block_length_;
    }
    if ((local_c8 & 0x20) != 0) {
      (from->field_0)._impl_.fixed_32_ = *(int32_t *)&(arena->impl_).first_arena_.field_0x6c;
    }
    if ((local_c8 & 0x40) != 0) {
      (from->field_0)._impl_.optional_enum_ = *(int *)&(arena->impl_).first_arena_.cached_blocks_;
    }
  }
  uVar3 = local_c8;
  puVar7 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar7 = uVar3 | *puVar7;
  uVar1 = (uint32_t)arena[1].impl_.alloc_policy_.policy_;
  if (uVar1 != 0) {
    uVar2 = (from->field_0)._impl_._oneof_case_[0];
    bVar15 = uVar2 != uVar1;
    if (bVar15) {
      if (uVar2 != 0) {
        clear_oneof_field(from);
      }
      (from->field_0)._impl_._oneof_case_[0] = uVar1;
    }
    if (uVar1 != 0) {
      if (uVar1 == 0x1ffffc7b) {
        *(int *)((long)&from->field_0 + 0x98) = (int)arena[1].impl_.tag_and_id_;
      }
      else if (uVar1 == 0x1ffffc7c) {
        if (bVar15) {
          local_58 = (void *)arena[1].impl_.tag_and_id_;
          local_50 = absl_log_internal_check_op_result;
          pTVar11 = (TestAllTypesLite *)
                    google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                              ((Arena *)absl_log_internal_check_op_result,local_58);
          (from->field_0)._impl_.oneof_field_.oneof_test_all_types_ = pTVar11;
        }
        else {
          TestAllTypesLite::MergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_test_all_types_,
                     (TestAllTypesLite *)arena[1].impl_.tag_and_id_);
        }
      }
      else if (uVar1 == 0x1ffffc7d) {
        if (bVar15) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar13 = &from->field_0;
        psVar12 = _internal_oneof_string_abi_cxx11_((TestHugeFieldNumbersLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar13->_impl_).oneof_field_.oneof_string_,psVar12,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x1ffffc7e) {
        if (bVar15) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar13 = &from->field_0;
        psVar12 = _internal_oneof_bytes_abi_cxx11_((TestHugeFieldNumbersLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar13->_impl_).oneof_field_.oneof_string_,psVar12,
                   (Arena *)absl_log_internal_check_op_result);
      }
    }
  }
  paVar13 = &from->field_0;
  pTVar14 = default_instance();
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(paVar13->_impl_)._extensions_,&pTVar14->super_MessageLite,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestHugeFieldNumbersLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHugeFieldNumbersLite*>(&to_msg);
  auto& from = static_cast<const TestHugeFieldNumbersLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestHugeFieldNumbersLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_packed_int32()->MergeFrom(from._internal_packed_int32());
  _this->_impl_.string_string_map_.MergeFrom(from._impl_.string_string_map_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_message_ != nullptr);
      if (_this->_impl_.optional_message_ == nullptr) {
        _this->_impl_.optional_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_message_);
      } else {
        _this->_impl_.optional_message_->MergeFrom(*from._impl_.optional_message_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.fixed_32_ = from._impl_.fixed_32_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_enum_ = from._impl_.optional_enum_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofTestAllTypes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_test_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_test_all_types_);
        } else {
          _this->_impl_.oneof_field_.oneof_test_all_types_->MergeFrom(*from._impl_.oneof_field_.oneof_test_all_types_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}